

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O0

void timer_cb(uv_timer_t *timer,int status)

{
  int iVar1;
  uint64_t uVar2;
  undefined4 in_ESI;
  uv_loop_t *in_RDI;
  poll_ctx *ctx;
  void **path;
  undefined4 in_stack_fffffffffffffff0;
  
  path = in_RDI[-1].inotify_read_watcher.watcher_queue + 1;
  if (*path == (void *)0x0) {
    __assert_fail("ctx->parent_handle != NULL","src/fs-poll.c",0x82,
                  "void timer_cb(uv_timer_t *, int)");
  }
  if ((void **)*(long **)((long)*path + 0x40) == path) {
    uVar2 = uv_now((uv_loop_t *)in_RDI[-1].inotify_watchers);
    path[2] = (void *)uVar2;
    iVar1 = uv_fs_stat(in_RDI,(uv_fs_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(char *)path,
                       (uv_fs_cb)0x108aa9);
    if (iVar1 != 0) {
      abort();
    }
    return;
  }
  __assert_fail("ctx->parent_handle->poll_ctx == ctx","src/fs-poll.c",0x83,
                "void timer_cb(uv_timer_t *, int)");
}

Assistant:

static void timer_cb(uv_timer_t* timer, int status) {
  struct poll_ctx* ctx;

  ctx = container_of(timer, struct poll_ctx, timer_handle);
  assert(ctx->parent_handle != NULL);
  assert(ctx->parent_handle->poll_ctx == ctx);
  ctx->start_time = uv_now(ctx->loop);

  if (uv_fs_stat(ctx->loop, &ctx->fs_req, ctx->path, poll_cb))
    abort();
}